

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O2

void __thiscall Simulation::handleInputs(Simulation *this)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  vec<3,_float,_(glm::qualifier)0> vVar6;
  vec<3,_float,_(glm::qualifier)0> local_40;
  vec<3,_float,_(glm::qualifier)0> local_30;
  double local_20;
  
  bVar1 = Input::keyIsDown(0x57);
  if (bVar1) {
    local_30 = glm::operator*(&(this->_camera).front,(this->_camera).speed);
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_30);
  }
  bVar1 = Input::keyIsDown(0x41);
  if (bVar1) {
    local_40 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                         (&(this->_camera).front,&(this->_camera).up);
    vVar6 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_40);
    fVar5 = (this->_camera).speed;
    local_30.field_1.y = vVar6.field_1.y * fVar5;
    local_30.field_0.x = fVar5 * vVar6.field_0.x;
    local_30.field_2.z = fVar5 * vVar6.field_2.z;
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_30);
  }
  bVar1 = Input::keyIsDown(0x53);
  if (bVar1) {
    local_30 = glm::operator*(&(this->_camera).front,(this->_camera).speed);
    glm::vec<3,float,(glm::qualifier)0>::operator-=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_30);
  }
  bVar1 = Input::keyIsDown(0x44);
  if (bVar1) {
    local_40 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                         (&(this->_camera).front,&(this->_camera).up);
    vVar6 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_40);
    fVar5 = (this->_camera).speed;
    local_30.field_1.y = vVar6.field_1.y * fVar5;
    local_30.field_0.x = fVar5 * vVar6.field_0.x;
    local_30.field_2.z = fVar5 * vVar6.field_2.z;
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              ((vec<3,float,(glm::qualifier)0> *)&(this->_camera).transform,&local_30);
  }
  bVar1 = Input::keyIsDown(0x154);
  if (bVar1) {
    (this->_camera).transform.position.field_1.y =
         (this->_camera).speed + (this->_camera).transform.position.field_1.y;
  }
  bVar1 = Input::keyIsDown(0x155);
  if (bVar1) {
    (this->_camera).transform.position.field_1.y =
         (this->_camera).transform.position.field_1.y - (this->_camera).speed;
  }
  fVar2 = Input::mouseOffsetX + (this->_camera).yaw;
  (this->_camera).yaw = fVar2;
  fVar4 = (this->_camera).pitch - Input::mouseOffsetY;
  fVar5 = -89.9;
  if (-89.9 <= fVar4) {
    fVar5 = fVar4;
  }
  fVar4 = 89.9;
  if (fVar5 <= 89.9) {
    fVar4 = fVar5;
  }
  (this->_camera).pitch = fVar4;
  local_20 = cos((double)(fVar2 * 0.017453292));
  dVar3 = cos((double)((this->_camera).pitch * 0.017453292));
  local_30.field_0.x = (float)(dVar3 * local_20);
  dVar3 = sin((double)((this->_camera).pitch * 0.017453292));
  local_30.field_1.y = (float)dVar3;
  local_20 = sin((double)((this->_camera).yaw * 0.017453292));
  dVar3 = cos((double)((this->_camera).pitch * 0.017453292));
  local_30.field_2.z = (float)(dVar3 * local_20);
  vVar6 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_30);
  local_30._0_8_ = vVar6._0_8_;
  (this->_camera).front.field_0 = local_30.field_0;
  (this->_camera).front.field_1 = local_30.field_1;
  local_30.field_2 = vVar6.field_2;
  (this->_camera).front.field_2 = local_30.field_2;
  local_30 = vVar6;
  Input::updateMouseMovements();
  return;
}

Assistant:

void Simulation::handleInputs()
{
    if (Input::keyIsDown(GLFW_KEY_W))
    {
        _camera.transform.position += _camera.front * _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_A))
    {
        _camera.transform.position -=
            glm::normalize(glm::cross(_camera.front, _camera.up)) *
            _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_S))
    {
        _camera.transform.position -= _camera.front * _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_D))
    {
        _camera.transform.position +=
            glm::normalize(glm::cross(_camera.front, _camera.up)) *
            _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_LEFT_SHIFT))
    {
        _camera.transform.position.y += _camera.speed;
    }
    if (Input::keyIsDown(GLFW_KEY_LEFT_CONTROL))
    {
        _camera.transform.position.y -= _camera.speed;
    }

    float sensitivity = 1.0f;
    _camera.yaw += Input::mouseOffsetX*sensitivity;
    _camera.pitch =
        glm::clamp(_camera.pitch - Input::mouseOffsetY*sensitivity,
                -89.9f, 89.9f);

    glm::vec3 dir;
    dir.x = cos(glm::radians(_camera.yaw))*cos(glm::radians(_camera.pitch));
    dir.y = sin(glm::radians(_camera.pitch));
    dir.z = sin(glm::radians(_camera.yaw))*cos(glm::radians(_camera.pitch));
    dir = glm::normalize(dir);
    _camera.front = dir;

    Input::updateMouseMovements();
}